

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::Block<Eigen::Matrix<float,_1,_8,_1,_1,_8>,_1,_-1,_false>::Block
          (Block<Eigen::Matrix<float,_1,_8,_1,_1,_8>,_1,__1,_false> *this,
          Matrix<float,_1,_8,_1,_1,_8> *xpr,Index startRow,Index startCol,Index blockRows,
          Index blockCols)

{
  bool bVar1;
  Index IVar2;
  Index blockCols_local;
  Index blockRows_local;
  Index startCol_local;
  Index startRow_local;
  Matrix<float,_1,_8,_1,_1,_8> *xpr_local;
  Block<Eigen::Matrix<float,_1,_8,_1,_1,_8>,_1,__1,_false> *this_local;
  
  BlockImpl<Eigen::Matrix<float,_1,_8,_1,_1,_8>,_1,_-1,_false,_Eigen::Dense>::BlockImpl
            (&this->super_BlockImpl<Eigen::Matrix<float,_1,_8,_1,_1,_8>,_1,__1,_false,_Eigen::Dense>
             ,xpr,startRow,startCol,blockRows,blockCols);
  if (blockRows != 1) {
    __assert_fail("(RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows) && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                  ,0x91,
                  "Eigen::Block<Eigen::Matrix<float, 1, 8, 1, 1, 8>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, 1, 8, 1, 1, 8>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  bVar1 = false;
  if (-1 < startRow) {
    IVar2 = PlainObjectBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>::rows
                      (&xpr->super_PlainObjectBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>);
    bVar1 = false;
    if (((startRow <= IVar2 + -1) && (bVar1 = false, -1 < startCol)) &&
       (bVar1 = false, -1 < blockCols)) {
      IVar2 = PlainObjectBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>::cols
                        (&xpr->super_PlainObjectBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>);
      bVar1 = startCol <= IVar2 - blockCols;
    }
  }
  if (!bVar1) {
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                  ,0x93,
                  "Eigen::Block<Eigen::Matrix<float, 1, 8, 1, 1, 8>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, 1, 8, 1, 1, 8>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  return;
}

Assistant:

Block(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Impl(xpr, startRow, startCol, blockRows, blockCols)
    {
      eigen_assert((RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows)
          && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols));
      eigen_assert(startRow >= 0 && blockRows >= 0 && startRow  <= xpr.rows() - blockRows
          && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols);
    }